

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_ui.cpp
# Opt level: O0

void __thiscall UiWindowX11::UiWindowX11(UiWindowX11 *this,Image *image,string *title)

{
  long lVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  long lVar7;
  ImageTemplate<unsigned_char> *in_RSI;
  Image *in_RDI;
  UiWindowX11 *unaff_retaddr;
  string *in_stack_ffffffffffffff70;
  Image *in_stack_ffffffffffffff78;
  UiWindow *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined8 uVar8;
  imageException *in_stack_ffffffffffffff90;
  Image *image_00;
  
  image_00 = in_RDI;
  UiWindow::UiWindow(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  in_RDI->_vptr_ImageTemplate = (_func_int **)&PTR__UiWindowX11_0014ecd8;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10fbfe);
  *(undefined8 *)&in_RDI[2]._type = 0;
  *(undefined4 *)&in_RDI[3]._vptr_ImageTemplate = 0;
  in_RDI[3]._width = 0;
  in_RDI[3]._height = 0;
  in_RDI[3]._colorCount = '\0';
  in_RDI[3]._alignment = '\0';
  *(undefined2 *)&in_RDI[3].field_0x12 = 0;
  in_RDI[3]._rowSize = 0;
  in_RDI[3]._data = (uchar *)0x0;
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
  *(uint32_t *)&in_RDI[3]._type = uVar3;
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
  *(uint32_t *)&in_RDI[3].field_0x24 = uVar3;
  std::
  vector<std::pair<PointBase2D<double>,_unsigned_int>,_std::allocator<std::pair<PointBase2D<double>,_unsigned_int>_>_>
  ::vector((vector<std::pair<PointBase2D<double>,_unsigned_int>,_std::allocator<std::pair<PointBase2D<double>,_unsigned_int>_>_>
            *)0x10fca6);
  uVar4 = XOpenDisplay(0);
  *(undefined8 *)&in_RDI[2]._type = uVar4;
  if (*(long *)&in_RDI[2]._type == 0) {
    uVar4 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
  }
  lVar1 = *(long *)(*(long *)&in_RDI[2]._type + 0xe8);
  lVar7 = (long)*(int *)&in_RDI[3]._vptr_ImageTemplate * 0x80;
  uVar4 = XCreateSimpleWindow(*(long *)&in_RDI[2]._type,*(undefined8 *)(lVar1 + 0x10 + lVar7),10,10,
                              *(undefined4 *)&in_RDI[3]._type,*(undefined4 *)&in_RDI[3].field_0x24,1
                              ,*(undefined8 *)(lVar1 + 0x60 + lVar7),
                              *(undefined8 *)(lVar1 + 0x58 + lVar7));
  in_RDI[3]._width = (int)uVar4;
  in_RDI[3]._height = (int)((ulong)uVar4 >> 0x20);
  uVar4._0_4_ = in_RDI[3]._width;
  uVar4._4_4_ = in_RDI[3]._height;
  XSelectInput(*(undefined8 *)&in_RDI[2]._type,uVar4,0x8001);
  uVar5._0_4_ = in_RDI[3]._width;
  uVar5._4_4_ = in_RDI[3]._height;
  XMapWindow(*(undefined8 *)&in_RDI[2]._type,uVar5);
  uVar4 = *(undefined8 *)&in_RDI[2]._type;
  uVar8._0_4_ = in_RDI[3]._width;
  uVar8._4_4_ = in_RDI[3]._height;
  uVar5 = std::__cxx11::string::data();
  XStoreName(uVar4,uVar8,uVar5);
  puVar6 = (uchar *)XInternAtom(*(undefined8 *)&in_RDI[2]._type,"WM_DELETE_WINDOW",0);
  in_RDI[3]._data = puVar6;
  uVar2._0_4_ = in_RDI[3]._width;
  uVar2._4_4_ = in_RDI[3]._height;
  XSetWMProtocols(*(undefined8 *)&in_RDI[2]._type,uVar2,&in_RDI[3]._data,1);
  _setupImage(unaff_retaddr,image_00);
  return;
}

Assistant:

UiWindowX11::UiWindowX11( const PenguinV_Image::Image & image, const std::string & title )
    : UiWindow( image, title )
    , _uiDisplay( nullptr )
    , _screen( 0 )
    , _window( 0 )
    , _image( nullptr )
    , _deleteWindowEvent( 0 )
    , _width( image.width() )
    , _height( image.height() )
{
    _uiDisplay = XOpenDisplay( NULL );
    if ( _uiDisplay == nullptr )
        throw imageException( "Cannot create window for display" );

    _window = XCreateSimpleWindow( _uiDisplay, RootWindow( _uiDisplay, _screen ), 10, 10, _width, _height, 1,
                                   BlackPixel( _uiDisplay, _screen ), WhitePixel( _uiDisplay, _screen ) );
    XSelectInput( _uiDisplay, _window, ExposureMask | KeyPressMask );
    XMapWindow( _uiDisplay, _window );

    XStoreName( _uiDisplay, _window, title.data() );

    _deleteWindowEvent = XInternAtom( _uiDisplay, "WM_DELETE_WINDOW", False );
    XSetWMProtocols( _uiDisplay, _window, &_deleteWindowEvent, 1 );

    _setupImage( image );
}